

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

bool __thiscall lunasvg::RuleData::isLessThan(RuleData *this,RuleData *rule)

{
  bool bVar1;
  tuple<const_unsigned_long_&,_const_unsigned_long_&> local_38;
  tuple<const_unsigned_long_&,_const_unsigned_long_&> local_28;
  RuleData *local_18;
  RuleData *rule_local;
  RuleData *this_local;
  
  local_18 = rule;
  rule_local = this;
  std::tie<unsigned_long_const,unsigned_long_const>((unsigned_long *)&local_28,&this->m_specificity)
  ;
  std::tie<unsigned_long_const,unsigned_long_const>
            ((unsigned_long *)&local_38,&local_18->m_specificity);
  bVar1 = std::operator<(&local_28,&local_38);
  return bVar1;
}

Assistant:

bool isLessThan(const RuleData& rule) const { return std::tie(m_specificity, m_position) < std::tie(rule.m_specificity, rule.m_position); }